

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
despot::Floor::ComputeShortestPath
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Floor *this,int start,int end)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined1 *second;
  long lVar5;
  int a;
  long lVar6;
  double dVar7;
  int move;
  Coord pos;
  value_type_conflict1 local_64;
  vector<int,_std::allocator<int>_> *local_60;
  int local_54;
  long local_50;
  double local_48;
  Coord local_40;
  Coord local_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = (long)end;
  local_60 = __return_storage_ptr__;
  local_54 = end;
  do {
    if (start == local_54) {
      return local_60;
    }
    local_64 = 0;
    lVar5 = (long)start;
    local_48 = *(double *)
                (*(long *)&(this->dist_).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar5].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data + local_50 * 8);
    dVar7 = (double)(int)((ulong)((long)(this->cells_).
                                        super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->cells_).
                                       super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if ((local_48 == dVar7) && (!NAN(local_48) && !NAN(dVar7))) {
      return local_60;
    }
    second = Compass::DIRECTIONS;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      local_40 = (this->cells_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar5];
      local_38 = operator+(&local_40,(Coord *)second);
      bVar2 = Inside(this,local_38);
      lVar4 = lVar5;
      iVar3 = start;
      if (bVar2) {
        iVar3 = GetIndex(this,&local_38);
        lVar4 = (long)iVar3;
      }
      pdVar1 = (double *)
               (*(long *)&(this->dist_).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar4].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + local_50 * 8);
      if (*pdVar1 <= local_48 && local_48 != *pdVar1) {
        local_64 = (value_type_conflict1)lVar6;
        start = iVar3;
        break;
      }
      second = (undefined1 *)((long)second + 8);
    }
    std::vector<int,_std::allocator<int>_>::push_back(local_60,&local_64);
  } while( true );
}

Assistant:

vector<int> Floor::ComputeShortestPath(int start, int end) const {
	int cur = start;
	vector<int> moves;
	while (cur != end) {
		int move = 0;
		double cur_dist = Distance(cur, end);

		if (cur_dist == NumCells()) {
			return moves;
		}

		for (int a = 0; a < 4; a++) {
			Coord pos = GetCell(cur) + Compass::DIRECTIONS[a];
			int next = cur;
			if (Inside(pos))
				next = GetIndex(pos);

			double dist = Distance(next, end);

			if (dist < cur_dist) {
				move = a;
				cur = next;
				break;
			}
		}
		moves.push_back(move);
	}
	return moves;
}